

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockParameterTest.cpp
# Opt level: O0

void __thiscall
TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToValue_TestShell::
TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToValue_TestShell
          (TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToValue_TestShell *this)

{
  TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToValue_TestShell *this_local;
  
  UtestShell::UtestShell(&this->super_UtestShell);
  (this->super_UtestShell)._vptr_UtestShell =
       (_func_int **)
       &PTR__TEST_MockParameterTest_expectOneIntegerParameterAndFailsDueToValue_TestShell_0035d230;
  return;
}

Assistant:

TEST(MockParameterTest, expectOneIntegerParameterAndFailsDueToValue)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("foo")->withParameter("parameter", 10);
    MockNamedValue parameter("parameter");
    parameter.setValue(8);
    MockUnexpectedInputParameterFailure expectedFailure(mockFailureTest(), "foo", parameter, expectations);

    mock().expectOneCall("foo").withParameter("parameter", 10);
    mock().actualCall("foo").withParameter("parameter", 8);

    CHECK_EXPECTED_MOCK_FAILURE(expectedFailure);
}